

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

QString * __thiscall
QWidgetLineControl::maskString(QWidgetLineControl *this,int pos,QString *str,bool clear)

{
  QStringView v;
  QStringView v_00;
  bool bVar1;
  int iVar2;
  long n_00;
  qsizetype qVar3;
  type pMVar4;
  QString *in_RCX;
  int in_EDX;
  long in_RSI;
  QWidgetLineControl *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  int n;
  int i;
  int strIndex;
  QString *s;
  QString fill;
  QString *in_stack_fffffffffffffeb8;
  Casemode in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  type in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed2;
  undefined1 in_stack_fffffffffffffed3;
  undefined1 in_stack_fffffffffffffed4;
  undefined1 in_stack_fffffffffffffed5;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  int iVar7;
  Casemode in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee0;
  QWidgetLineControl *pQVar8;
  int local_c0;
  int local_b8;
  QString local_88;
  char16_t local_64;
  char16_t local_62;
  char16_t local_60;
  char16_t local_5e;
  char16_t local_5c;
  char16_t local_5a;
  storage_type *local_58;
  undefined1 local_48 [24];
  QString local_30;
  storage_type *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX < *(int *)(in_RSI + 0x60)) {
    local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    pQVar8 = in_RDI;
    QString::QString((QString *)0x5de34a);
    if ((in_R8B & 1) == 0) {
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffeb8);
    }
    else {
      clearString(pQVar8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  (int)in_stack_fffffffffffffee0);
    }
    QString::operator=(&local_30,(QString *)local_48);
    QString::~QString((QString *)0x5de3a5);
    local_b8 = 0;
    *(undefined1 **)pQVar8 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&pQVar8->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&pQVar8->field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView<1ul>
              ((QByteArrayView *)
               CONCAT17(in_stack_fffffffffffffed7,
                        CONCAT16(in_stack_fffffffffffffed6,
                                 CONCAT15(in_stack_fffffffffffffed5,
                                          CONCAT14(in_stack_fffffffffffffed4,
                                                   CONCAT13(in_stack_fffffffffffffed3,
                                                            CONCAT12(in_stack_fffffffffffffed2,
                                                                     in_stack_fffffffffffffed0))))))
               ,(char (*) [1])in_stack_fffffffffffffec8);
    QVar6.m_data = local_58;
    QVar6.m_size = (qsizetype)pQVar8;
    QString::fromLatin1(QVar6);
    local_c0 = in_EDX;
    while (local_c0 < *(int *)(in_RSI + 0x60)) {
      n_00 = (long)local_b8;
      qVar3 = QString::size(in_RCX);
      if (qVar3 <= n_00) break;
      pMVar4 = std::
               unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
               ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                             *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            (size_t)in_stack_fffffffffffffeb8);
      if ((pMVar4->separator & 1U) == 0) {
        QString::operator[]((QString *)in_stack_fffffffffffffec8,
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        pMVar4 = std::
                 unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                               *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (size_t)in_stack_fffffffffffffeb8);
        local_5e = (pMVar4->maskChar).ucs;
        bVar1 = isValidInput((QWidgetLineControl *)
                             CONCAT17(in_stack_fffffffffffffed7,
                                      CONCAT16(in_stack_fffffffffffffed6,
                                               CONCAT15(in_stack_fffffffffffffed5,
                                                        CONCAT14(in_stack_fffffffffffffed4,
                                                                 CONCAT13(in_stack_fffffffffffffed3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffed2,
                                                  in_stack_fffffffffffffed0)))))),
                             (QChar)(char16_t)((ulong)in_RSI >> 0x30),
                             (QChar)(char16_t)((ulong)in_RSI >> 0x20));
        if (bVar1) {
          pMVar4 = std::
                   unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                   ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                (size_t)in_stack_fffffffffffffeb8);
          in_stack_fffffffffffffedc = pMVar4->caseMode;
          if (in_stack_fffffffffffffedc == Upper) {
            local_60 = (char16_t)
                       QString::operator[]((QString *)in_stack_fffffffffffffec8,
                                           CONCAT44(in_stack_fffffffffffffec4,
                                                    in_stack_fffffffffffffec0));
            QChar::toUpper((QChar *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            QString::operator+=((QString *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                (QChar)(char16_t)((ulong)in_stack_fffffffffffffec8 >> 0x30));
          }
          else if (in_stack_fffffffffffffedc == Lower) {
            local_62 = (char16_t)
                       QString::operator[]((QString *)in_stack_fffffffffffffec8,
                                           CONCAT44(in_stack_fffffffffffffec4,
                                                    in_stack_fffffffffffffec0));
            QChar::toLower((QChar *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            QString::operator+=((QString *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                (QChar)(char16_t)((ulong)in_stack_fffffffffffffec8 >> 0x30));
          }
          else {
            QString::operator[]((QString *)in_stack_fffffffffffffec8,
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            QString::operator+=((QString *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                (QChar)(char16_t)((ulong)in_stack_fffffffffffffec8 >> 0x30));
          }
          local_c0 = local_c0 + 1;
        }
        else {
          iVar7 = local_c0;
          QString::operator[]((QString *)in_stack_fffffffffffffec8,
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          iVar2 = findInMask((QWidgetLineControl *)CONCAT44(in_stack_fffffffffffffedc,iVar7),
                             CONCAT13(in_stack_fffffffffffffed7,
                                      CONCAT12(in_stack_fffffffffffffed6,
                                               CONCAT11(in_stack_fffffffffffffed5,
                                                        in_stack_fffffffffffffed4))),
                             (bool)in_stack_fffffffffffffed3,(bool)in_stack_fffffffffffffed2,
                             (QChar)(char16_t)((ulong)pQVar8 >> 0x30));
          if (iVar2 == -1) {
            in_stack_fffffffffffffec4 = local_c0;
            QString::operator[]((QString *)in_stack_fffffffffffffec8,
                                CONCAT44(local_c0,in_stack_fffffffffffffec0));
            iVar2 = findInMask((QWidgetLineControl *)CONCAT44(in_stack_fffffffffffffedc,iVar7),
                               CONCAT13(in_stack_fffffffffffffed7,
                                        CONCAT12(in_stack_fffffffffffffed6,
                                                 CONCAT11(in_stack_fffffffffffffed5,
                                                          in_stack_fffffffffffffed4))),
                               (bool)in_stack_fffffffffffffed3,(bool)in_stack_fffffffffffffed2,
                               (QChar)(char16_t)((ulong)pQVar8 >> 0x30));
            if (iVar2 != -1) {
              in_stack_fffffffffffffeb8 = &local_88;
              QStringView::QStringView<QString,_true>
                        ((QStringView *)
                         CONCAT17(in_stack_fffffffffffffed7,
                                  CONCAT16(in_stack_fffffffffffffed6,
                                           CONCAT15(in_stack_fffffffffffffed5,
                                                    CONCAT14(in_stack_fffffffffffffed4,
                                                             CONCAT13(in_stack_fffffffffffffed3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffed2,
                                                  in_stack_fffffffffffffed0)))))),
                         (QString *)in_stack_fffffffffffffec8);
              QStringView::mid((QStringView *)CONCAT44(in_stack_fffffffffffffedc,iVar7),
                               (qsizetype)pQVar8,n_00);
              v_00.m_size._2_1_ = in_stack_fffffffffffffed2;
              v_00.m_size._0_2_ = in_stack_fffffffffffffed0;
              v_00.m_size._3_1_ = in_stack_fffffffffffffed3;
              v_00.m_size._4_1_ = in_stack_fffffffffffffed4;
              v_00.m_size._5_1_ = in_stack_fffffffffffffed5;
              v_00.m_size._6_1_ = in_stack_fffffffffffffed6;
              v_00.m_size._7_1_ = in_stack_fffffffffffffed7;
              v_00.m_data._0_4_ = iVar7;
              v_00.m_data._4_4_ = in_stack_fffffffffffffedc;
              QString::operator+=(in_stack_fffffffffffffeb8,v_00);
              pMVar4 = std::
                       unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                       ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                     *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                                    ,(size_t)in_stack_fffffffffffffeb8);
              in_stack_fffffffffffffec0 = pMVar4->caseMode;
              if (in_stack_fffffffffffffec0 == Upper) {
                QString::operator[]((QString *)in_stack_fffffffffffffec8,
                                    CONCAT44(in_stack_fffffffffffffec4,1));
                QChar::toUpper((QChar *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                ));
                QString::operator+=((QString *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    (QChar)(char16_t)((ulong)in_stack_fffffffffffffec8 >> 0x30));
              }
              else if (in_stack_fffffffffffffec0 == Lower) {
                QString::operator[]((QString *)in_stack_fffffffffffffec8,
                                    CONCAT44(in_stack_fffffffffffffec4,2));
                QChar::toLower((QChar *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                ));
                QString::operator+=((QString *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    (QChar)(char16_t)((ulong)in_stack_fffffffffffffec8 >> 0x30));
              }
              else {
                QString::operator[]((QString *)in_stack_fffffffffffffec8,
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
                QString::operator+=((QString *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    (QChar)(char16_t)((ulong)in_stack_fffffffffffffec8 >> 0x30));
              }
              local_c0 = iVar2 + 1;
            }
          }
          else {
            qVar3 = QString::size(in_RCX);
            in_stack_fffffffffffffed7 = true;
            if (((qVar3 == 1) && (in_stack_fffffffffffffed7 = true, local_c0 != 0)) &&
               (in_stack_fffffffffffffed6 = false, in_stack_fffffffffffffed7 = false, 0 < local_c0))
            {
              pMVar4 = std::
                       unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                       ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                     *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                                    ,(size_t)in_stack_fffffffffffffeb8);
              in_stack_fffffffffffffed5 = true;
              in_stack_fffffffffffffed6 = in_stack_fffffffffffffed5;
              in_stack_fffffffffffffed7 = in_stack_fffffffffffffed5;
              if ((pMVar4->separator & 1U) != 0) {
                in_stack_fffffffffffffec8 =
                     std::
                     unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                     ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                   *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  (size_t)in_stack_fffffffffffffeb8);
                local_64 = (char16_t)
                           QString::operator[]((QString *)in_stack_fffffffffffffec8,
                                               CONCAT44(in_stack_fffffffffffffec4,
                                                        in_stack_fffffffffffffec0));
                in_stack_fffffffffffffed5 =
                     ::operator!=((QChar *)CONCAT44(in_stack_fffffffffffffec4,
                                                    in_stack_fffffffffffffec0),
                                  (QChar *)in_stack_fffffffffffffeb8);
                in_stack_fffffffffffffed6 = in_stack_fffffffffffffed5;
                in_stack_fffffffffffffed7 = in_stack_fffffffffffffed5;
              }
            }
            if ((bool)in_stack_fffffffffffffed7 != false) {
              QStringView::QStringView<QString,_true>
                        ((QStringView *)
                         CONCAT17(in_stack_fffffffffffffed7,
                                  CONCAT16(in_stack_fffffffffffffed6,
                                           CONCAT15(in_stack_fffffffffffffed5,
                                                    CONCAT14(in_stack_fffffffffffffed4,
                                                             CONCAT13(in_stack_fffffffffffffed3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffed2,
                                                  in_stack_fffffffffffffed0)))))),
                         (QString *)in_stack_fffffffffffffec8);
              QStringView::mid((QStringView *)CONCAT44(in_stack_fffffffffffffedc,iVar7),
                               (qsizetype)pQVar8,n_00);
              v.m_size._2_1_ = in_stack_fffffffffffffed2;
              v.m_size._0_2_ = in_stack_fffffffffffffed0;
              v.m_size._3_1_ = in_stack_fffffffffffffed3;
              v.m_size._4_1_ = in_stack_fffffffffffffed4;
              v.m_size._5_1_ = in_stack_fffffffffffffed5;
              v.m_size._6_1_ = in_stack_fffffffffffffed6;
              v.m_size._7_1_ = in_stack_fffffffffffffed7;
              v.m_data._0_4_ = iVar7;
              v.m_data._4_4_ = in_stack_fffffffffffffedc;
              QString::operator+=(in_stack_fffffffffffffeb8,v);
              local_c0 = iVar2 + 1;
            }
          }
        }
        local_b8 = local_b8 + 1;
      }
      else {
        pMVar4 = std::
                 unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                               *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (size_t)in_stack_fffffffffffffeb8);
        local_5a = (pMVar4->maskChar).ucs;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                            ,(QChar)(char16_t)((ulong)in_stack_fffffffffffffec8 >> 0x30));
        local_5c = (char16_t)
                   QString::operator[]((QString *)in_stack_fffffffffffffec8,
                                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                                      );
        std::
        unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
        ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                      *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (size_t)in_stack_fffffffffffffeb8);
        bVar1 = ::operator==((QChar *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             (QChar *)in_stack_fffffffffffffeb8);
        if (bVar1) {
          local_b8 = local_b8 + 1;
        }
        local_c0 = local_c0 + 1;
      }
    }
    QString::~QString((QString *)0x5dea04);
  }
  else {
    pQVar8 = in_RDI;
    QByteArrayView::QByteArrayView<1ul>
              ((QByteArrayView *)
               CONCAT17(in_stack_fffffffffffffed7,
                        CONCAT16(in_stack_fffffffffffffed6,
                                 CONCAT15(in_stack_fffffffffffffed5,
                                          CONCAT14(in_stack_fffffffffffffed4,
                                                   CONCAT13(in_stack_fffffffffffffed3,
                                                            CONCAT12(in_stack_fffffffffffffed2,
                                                                     in_stack_fffffffffffffed0))))))
               ,(char (*) [1])in_stack_fffffffffffffec8);
    QVar5.m_data = local_18;
    QVar5.m_size = (qsizetype)pQVar8;
    QString::fromLatin1(QVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QWidgetLineControl::maskString(int pos, const QString &str, bool clear) const
{
    if (pos >= m_maxLength)
        return QString::fromLatin1("");

    QString fill;
    fill = clear ? clearString(0, m_maxLength) : m_text;

    int strIndex = 0;
    QString s = QString::fromLatin1("");
    int i = pos;
    while (i < m_maxLength) {
        if (strIndex < str.size()) {
            if (m_maskData[i].separator) {
                s += m_maskData[i].maskChar;
                if (str[strIndex] == m_maskData[i].maskChar)
                    strIndex++;
                ++i;
            } else {
                if (isValidInput(str[strIndex], m_maskData[i].maskChar)) {
                    switch (m_maskData[i].caseMode) {
                    case MaskInputData::Upper:
                        s += str[strIndex].toUpper();
                        break;
                    case MaskInputData::Lower:
                        s += str[strIndex].toLower();
                        break;
                    default:
                        s += str[strIndex];
                    }
                    ++i;
                } else {
                    // search for separator first
                    int n = findInMask(i, true, true, str[strIndex]);
                    if (n != -1) {
                        if (str.size() != 1 || i == 0 || (i > 0 && (!m_maskData[i-1].separator || m_maskData[i-1].maskChar != str[strIndex]))) {
                            s += QStringView{fill}.mid(i, n - i + 1);
                            i = n + 1; // update i to find + 1
                        }
                    } else {
                        // search for valid m_blank if not
                        n = findInMask(i, true, false, str[strIndex]);
                        if (n != -1) {
                            s += QStringView{fill}.mid(i, n - i);
                            switch (m_maskData[n].caseMode) {
                            case MaskInputData::Upper:
                                s += str[strIndex].toUpper();
                                break;
                            case MaskInputData::Lower:
                                s += str[strIndex].toLower();
                                break;
                            default:
                                s += str[strIndex];
                            }
                            i = n + 1; // updates i to find + 1
                        }
                    }
                }
                ++strIndex;
            }
        } else
            break;
    }

    return s;
}